

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O2

int Bac_ObjIsCo(Bac_Ntk_t *p,int i)

{
  Bac_ObjType_t BVar1;
  int iVar2;
  
  BVar1 = Bac_ObjType(p,i);
  if (BVar1 == BAC_OBJ_PO) {
    return 1;
  }
  iVar2 = Bac_ObjIsBi(p,i);
  return iVar2;
}

Assistant:

static inline int            Bac_ObjIsCo( Bac_Ntk_t * p, int i )             { return Bac_ObjIsPo(p, i) || Bac_ObjIsBi(p, i);                                              }